

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# instance.cpp
# Opt level: O1

string * __thiscall
CharacterInstance::receive
          (string *__return_storage_ptr__,CharacterInstance *this,string *message_name,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *arguments)

{
  int iVar1;
  undefined8 *puVar2;
  
  iVar1 = std::__cxx11::string::compare((char *)message_name);
  if (iVar1 == 0) {
    op_get(__return_storage_ptr__,this,arguments);
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)message_name);
    if (iVar1 == 0) {
      op_set(__return_storage_ptr__,this,arguments);
    }
    else {
      iVar1 = std::__cxx11::string::compare((char *)message_name);
      if (iVar1 == 0) {
        op_isAlphabetic(__return_storage_ptr__,this,arguments);
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)message_name);
        if (iVar1 == 0) {
          op_isNumeric(__return_storage_ptr__,this,arguments);
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)message_name);
          if (iVar1 == 0) {
            op_isAlphanumeric(__return_storage_ptr__,this,arguments);
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)message_name);
            if (iVar1 == 0) {
              op_isSpace(__return_storage_ptr__,this,arguments);
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)message_name);
              if (iVar1 == 0) {
                op_isEqualTo(__return_storage_ptr__,this,arguments);
              }
              else {
                iVar1 = std::__cxx11::string::compare((char *)message_name);
                if (iVar1 == 0) {
                  op_isLessThan(__return_storage_ptr__,this,arguments);
                }
                else {
                  iVar1 = std::__cxx11::string::compare((char *)message_name);
                  if (iVar1 == 0) {
                    op_isLessThanOrEqualTo(__return_storage_ptr__,this,arguments);
                  }
                  else {
                    iVar1 = std::__cxx11::string::compare((char *)message_name);
                    if (iVar1 == 0) {
                      op_isGreaterThan(__return_storage_ptr__,this,arguments);
                    }
                    else {
                      iVar1 = std::__cxx11::string::compare((char *)message_name);
                      if (iVar1 != 0) {
                        puVar2 = (undefined8 *)__cxa_allocate_exception(8);
                        *puVar2 = "RuntimeError: invalid message.";
                        __cxa_throw(puVar2,&char_const*::typeinfo,0);
                      }
                      op_isGreaterThanOrEqualTo(__return_storage_ptr__,this,arguments);
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CharacterInstance::receive(const std::string& message_name, const std::vector<std::string>& arguments) {
    if (message_name == "get")
        return op_get(arguments);
    if (message_name == "set:")
        return op_set(arguments);
    if (message_name == "isAlphabetic?")
        return op_isAlphabetic(arguments);
    if (message_name == "isNumeric?")
        return op_isNumeric(arguments);
    if (message_name == "isAlphanumeric?")
        return op_isAlphanumeric(arguments);
    if (message_name == "isSpace?")
        return op_isSpace(arguments);
    if (message_name == "isEqualTo?")
        return op_isEqualTo(arguments);
    if (message_name == "isLessThan?")
        return op_isLessThan(arguments);
    if (message_name == "isLessThanOrEqualTo?")
        return op_isLessThanOrEqualTo(arguments);
    if (message_name == "isGreaterThan?")
        return op_isGreaterThan(arguments);
    if (message_name == "isGreaterThanOrEqualTo?")
        return op_isGreaterThanOrEqualTo(arguments);
    throw EXC_INVALID_MESSAGE;
}